

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageIO.c
# Opt level: O0

INT8U * ReadLabelFromFile(char *file_name)

{
  INT8U *__ptr;
  INT8U *labelList;
  INT32U pixel_index;
  INT32U image_index;
  INT32U number_of_image;
  FILE *fp;
  char *file_name_local;
  
  fp = (FILE *)file_name;
  printf("----------------\n");
  printf(anon_var_dwarf_4d7,fp);
  _image_index = fopen((char *)fp,"rb");
  if (_image_index == (FILE *)0x0) {
    printf("open image failed!(%s)\n",fp);
  }
  fread(&pixel_index,4,1,_image_index);
  printf("----------------\n");
  printf("number of labels : %d\n",(ulong)pixel_index);
  __ptr = (INT8U *)malloc((ulong)pixel_index);
  fread(__ptr,1,(ulong)pixel_index,_image_index);
  return __ptr;
}

Assistant:

INT8U * ReadLabelFromFile(const char *file_name){
    FILE * fp;
    INT32U number_of_image;
    INT32U image_index,pixel_index;
    INT8U * labelList;

    #if DEBUG_LEVEL>0
        printf("----------------\n");
        printf("打开文件（label）：%s\n",file_name);
    #endif
    fp = fopen(file_name,"rb");
    if(fp==NULL){
        printf("open image failed!(%s)\n",file_name);
    }
    //    图片的数量
    fread(&number_of_image,sizeof(INT32U),1,fp);
    #if DEBUG_LEVEL>0
        printf("----------------\n");
        printf("number of labels : %d\n",number_of_image);
    #endif

    labelList = malloc(sizeof(INT8U)*number_of_image);
//    for(image_index=0;image_index<number_of_image;image_index++){
    fread(labelList,sizeof(INT8U),number_of_image,fp);
//    assert(NULL);
    return labelList;
}